

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

void __thiscall
kj::InsertionOrderIndex::moveImpl(InsertionOrderIndex *this,size_t oldPos,size_t newPos)

{
  Link *pLVar1;
  Link *pLVar2;
  uint uVar3;
  
  pLVar1 = this->links;
  pLVar1[newPos + 1] = pLVar1[oldPos + 1];
  uVar3 = (int)newPos + 1;
  pLVar2 = this->links;
  pLVar2[pLVar1[oldPos + 1].next].prev = uVar3;
  pLVar2[pLVar1[oldPos + 1].prev].next = uVar3;
  return;
}

Assistant:

void InsertionOrderIndex::moveImpl(size_t oldPos, size_t newPos) {
  Link& link = links[oldPos + 1];
  Link& newLink = links[newPos + 1];

  newLink = link;

  KJ_DASSERT(links[link.next].prev == oldPos + 1);
  KJ_DASSERT(links[link.prev].next == oldPos + 1);
  links[link.next].prev = newPos + 1;
  links[link.prev].next = newPos + 1;

#ifdef KJ_DEBUG
  memset(&link, 0xff, sizeof(Link));
#endif
}